

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O2

void profile_handler(int sig,siginfo_t *info,void *ctx)

{
  uint uVar1;
  global_State *g;
  int iStack_8;
  
  g = profile_state.g;
  profile_state.samples = profile_state.samples + 1;
  if ((profile_state.g)->hookmask < 0x20) {
    uVar1 = (profile_state.g)->vmstate;
    if ((int)uVar1 < 0) {
      if (uVar1 < 0xfffffffd) {
        if (uVar1 == 0xfffffffc) {
          iStack_8 = 0x43;
        }
        else {
          iStack_8 = (uint)(uVar1 != 0xfffffffb) * 3 + 0x47;
        }
      }
      else {
        iStack_8 = 0x49;
      }
    }
    else {
      iStack_8 = 0x4e;
    }
    profile_state.vmstate = iStack_8;
    (profile_state.g)->hookmask = (profile_state.g)->hookmask | 0x80;
    lj_dispatch_update(g);
    return;
  }
  return;
}

Assistant:

static void profile_trigger(ProfileState *ps)
{
  global_State *g = ps->g;
  uint8_t mask;
  profile_lock(ps);
  ps->samples++;  /* Always increment number of samples. */
  mask = g->hookmask;
  if (!(mask & (HOOK_PROFILE|HOOK_VMEVENT|HOOK_GC))) {  /* Set profile hook. */
    int st = g->vmstate;
    ps->vmstate = st >= 0 ? 'N' :
		  st == ~LJ_VMST_INTERP ? 'I' :
		  /* Stubs for profiler hooks. */
		  st == ~LJ_VMST_LFUNC ? 'I' :
		  st == ~LJ_VMST_FFUNC ? 'I' :
		  st == ~LJ_VMST_CFUNC ? 'C' :
		  st == ~LJ_VMST_GC ? 'G' : 'J';
    g->hookmask = (mask | HOOK_PROFILE);
    lj_dispatch_update(g);
  }
  profile_unlock(ps);
}